

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

void duckdb::MedianAbsoluteDeviationOperation<float>::
     Finalize<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,float *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference n_p;
  float *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float fVar2;
  MadAccessor<float,_float,_float> accessor;
  float med;
  Interpolator<false> interp;
  value_type *q;
  QuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  FunctionData *in_stack_ffffffffffffff90;
  MadAccessor<float,_float,_float> in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffff90);
    n_p = vector<duckdb::QuantileValue,_true>::operator[]
                    ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff90,
                     CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<float,_std::allocator<float>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              ((Interpolator<false> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QuantileValue *)in_stack_ffffffffffffff98.median,(idx_t)n_p,
               (bool)in_stack_ffffffffffffff8f);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0xac8b26);
    Interpolator<false>::Operation<float,float,duckdb::QuantileDirect<float>>
              ((Interpolator<false> *)interp.CRN,(float *)interp.FRN,(Vector *)interp.RN,
               (QuantileDirect<float> *)interp._0_8_);
    MadAccessor<float,_float,_float>::MadAccessor
              ((MadAccessor<float,_float,_float> *)&stack0xffffffffffffff98,
               (float *)&stack0xffffffffffffffa4);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0xac8b5f);
    fVar2 = Interpolator<false>::Operation<float,float,duckdb::MadAccessor<float,float,float>>
                      ((Interpolator<false> *)interp.CRN,(float *)interp.FRN,(Vector *)interp.RN,
                       (MadAccessor<float,_float,_float> *)interp._0_8_);
    *in_RSI = fVar2;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}